

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O0

optional<supermap::KeyValue<char,_char>_> __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>::find
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *this,
          char *pattern,function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *less,
          function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *equal)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  KeyValue<char,_char> *in_RCX;
  optional<supermap::KeyValue<char,_char>_> *in_RDX;
  undefined8 extraout_RDX;
  function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)> *in_RDI;
  KeyValue<char,_char> firstLeqElem;
  KeyValue<char,_char> middleElem;
  char middle;
  char lastGt;
  char firstLeq;
  undefined4 in_stack_ffffffffffffffa8;
  _Storage<supermap::KeyValue<char,_char>,_true> local_38;
  bool local_36;
  char local_2b;
  char local_2a;
  _Storage<supermap::KeyValue<char,_char>,_true> local_3;
  bool local_1;
  
  cVar1 = (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 8))();
  if (cVar1 == '\0') {
    std::optional<supermap::KeyValue<char,_char>_>::optional
              ((optional<supermap::KeyValue<char,_char>_> *)&local_3);
  }
  else {
    local_2a = '\0';
    local_2b = (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 8))();
    cVar1 = local_2a;
    while (local_2a = cVar1, 1 < (int)local_2b - (int)local_2a) {
      cVar1 = (char)(((int)local_2a + (int)local_2b) / 2);
      (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 0x20))
                (in_RDI,(int)cVar1,(long)((int)local_2a + (int)local_2b) % 2 & 0xffffffff,cVar1);
      bVar2 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::operator()
                        (in_RDI,in_RCX,(char *)in_RDX);
      if ((!bVar2) &&
         (bVar2 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::
                  operator()(in_RDI,in_RCX,(char *)in_RDX), !bVar2)) {
        local_2b = cVar1;
        cVar1 = local_2a;
      }
    }
    iVar3 = (int)local_2a;
    cVar1 = (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 8))();
    if (iVar3 < cVar1) {
      (**(code **)(*(long *)&(in_RDI->super__Function_base)._M_functor + 0x20))
                (in_RDI,(int)local_2a,extraout_RDX,CONCAT31(cVar1 >> 7,local_2a));
      bVar2 = std::function<bool_(const_supermap::KeyValue<char,_char>_&,_const_char_&)>::operator()
                        (in_RDI,in_RCX,(char *)in_RDX);
      if (bVar2) {
        std::optional<supermap::KeyValue<char,_char>_>::
        optional<supermap::KeyValue<char,_char>_&,_true>
                  (in_RDX,(KeyValue<char,_char> *)CONCAT44(iVar3,in_stack_ffffffffffffffa8));
      }
      else {
        std::optional<supermap::KeyValue<char,_char>_>::optional
                  ((optional<supermap::KeyValue<char,_char>_> *)&local_3);
      }
    }
    else {
      std::optional<supermap::KeyValue<char,_char>_>::optional
                ((optional<supermap::KeyValue<char,_char>_> *)&local_3);
    }
  }
  local_36 = local_1;
  local_38 = local_3;
  return (_Optional_base<supermap::KeyValue<char,_char>,_true,_true>)
         (_Optional_base<supermap::KeyValue<char,_char>,_true,_true>)_local_38;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }